

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InvisibleButton(char *str_id,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  ImGuiWindow *pIVar1;
  undefined4 in_EDX;
  bool *in_RSI;
  undefined8 in_RDI;
  ImVec2 IVar2;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  ImGuiID id;
  ImGuiWindow *window;
  ImVec2 *lhs;
  ImVec2 local_58;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  ImGuiWindow *in_stack_ffffffffffffffc0;
  ImVec2 *size_00;
  undefined4 in_stack_ffffffffffffffc8;
  float fVar3;
  ImGuiButtonFlags flags_00;
  undefined4 in_stack_ffffffffffffffe0;
  ImGuiID id_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  id_00 = (ImGuiID)((ulong)in_RDI >> 0x20);
  pIVar1 = GetCurrentWindow();
  if ((pIVar1->SkipItems & 1U) == 0) {
    ImGuiWindow::GetID(in_stack_ffffffffffffffc0,
                       (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    size_00 = *(ImVec2 **)in_RSI;
    IVar2.y = in_stack_ffffffffffffffbc;
    IVar2.x = in_stack_ffffffffffffffb8;
    IVar2 = CalcItemSize(IVar2,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    fVar3 = IVar2.x;
    lhs = &(pIVar1->DC).CursorPos;
    local_58 = operator+(lhs,(ImVec2 *)0x1899c9);
    flags_00 = (ImGuiButtonFlags)((ulong)pIVar1 >> 0x20);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffb0,lhs,&local_58);
    ItemSize(size_00,in_stack_ffffffffffffffbc);
    bVar4 = ItemAdd((ImRect *)CONCAT44(fVar3,in_stack_ffffffffffffffc8),
                    (ImGuiID)((ulong)size_00 >> 0x20),
                    (ImRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar4) {
      bVar4 = ButtonBehavior((ImRect *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                             ,id_00,in_RSI,(bool *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                             flags_00);
    }
    else {
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::InvisibleButton(const char* str_id, const ImVec2& size_arg, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    // Cannot use zero-size for InvisibleButton(). Unlike Button() there is not way to fallback using the label size.
    IM_ASSERT(size_arg.x != 0.0f && size_arg.y != 0.0f);

    const ImGuiID id = window->GetID(str_id);
    ImVec2 size = CalcItemSize(size_arg, 0.0f, 0.0f);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(size);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    return pressed;
}